

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_SenderInvalidOpen_Test::TestBody(HPKETest_SenderInvalidOpen_Test *this)

{
  bool bVar1;
  int iVar2;
  evp_hpke_ctx_st *peVar3;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  char *pcVar4;
  string local_4f8;
  AssertHelper local_4d8;
  Message local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__1;
  size_t cleartext_len;
  uint8_t cleartext [128];
  string local_418;
  AssertHelper local_3f8;
  Message local_3f0 [3];
  int local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_;
  size_t enc_len;
  uint8_t enc [32];
  undefined1 local_390 [8];
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t public_key_r [32];
  uint8_t secret_key_r [32];
  size_t kMockCiphertextLen;
  uint8_t kMockCiphertext [100];
  HPKETest_SenderInvalidOpen_Test *this_local;
  
  kMockCiphertext[0x48] = '\0';
  kMockCiphertext[0x49] = '\0';
  kMockCiphertext[0x4a] = '\0';
  kMockCiphertext[0x4b] = '\0';
  kMockCiphertext[0x4c] = '\0';
  kMockCiphertext[0x4d] = '\0';
  kMockCiphertext[0x4e] = '\0';
  kMockCiphertext[0x4f] = '\0';
  kMockCiphertext[0x50] = '\0';
  kMockCiphertext[0x51] = '\0';
  kMockCiphertext[0x52] = '\0';
  kMockCiphertext[0x53] = '\0';
  kMockCiphertext[0x54] = '\0';
  kMockCiphertext[0x55] = '\0';
  kMockCiphertext[0x56] = '\0';
  kMockCiphertext[0x57] = '\0';
  kMockCiphertext[0x38] = '\0';
  kMockCiphertext[0x39] = '\0';
  kMockCiphertext[0x3a] = '\0';
  kMockCiphertext[0x3b] = '\0';
  kMockCiphertext[0x3c] = '\0';
  kMockCiphertext[0x3d] = '\0';
  kMockCiphertext[0x3e] = '\0';
  kMockCiphertext[0x3f] = '\0';
  kMockCiphertext[0x40] = '\0';
  kMockCiphertext[0x41] = '\0';
  kMockCiphertext[0x42] = '\0';
  kMockCiphertext[0x43] = '\0';
  kMockCiphertext[0x44] = '\0';
  kMockCiphertext[0x45] = '\0';
  kMockCiphertext[0x46] = '\0';
  kMockCiphertext[0x47] = '\0';
  kMockCiphertext[0x28] = '\0';
  kMockCiphertext[0x29] = '\0';
  kMockCiphertext[0x2a] = '\0';
  kMockCiphertext[0x2b] = '\0';
  kMockCiphertext[0x2c] = '\0';
  kMockCiphertext[0x2d] = '\0';
  kMockCiphertext[0x2e] = '\0';
  kMockCiphertext[0x2f] = '\0';
  kMockCiphertext[0x30] = '\0';
  kMockCiphertext[0x31] = '\0';
  kMockCiphertext[0x32] = '\0';
  kMockCiphertext[0x33] = '\0';
  kMockCiphertext[0x34] = '\0';
  kMockCiphertext[0x35] = '\0';
  kMockCiphertext[0x36] = '\0';
  kMockCiphertext[0x37] = '\0';
  kMockCiphertext[0x18] = '\0';
  kMockCiphertext[0x19] = '\0';
  kMockCiphertext[0x1a] = '\0';
  kMockCiphertext[0x1b] = '\0';
  kMockCiphertext[0x1c] = '\0';
  kMockCiphertext[0x1d] = '\0';
  kMockCiphertext[0x1e] = '\0';
  kMockCiphertext[0x1f] = '\0';
  kMockCiphertext[0x20] = '\0';
  kMockCiphertext[0x21] = '\0';
  kMockCiphertext[0x22] = '\0';
  kMockCiphertext[0x23] = '\0';
  kMockCiphertext[0x24] = '\0';
  kMockCiphertext[0x25] = '\0';
  kMockCiphertext[0x26] = '\0';
  kMockCiphertext[0x27] = '\0';
  kMockCiphertext[8] = '\0';
  kMockCiphertext[9] = '\0';
  kMockCiphertext[10] = '\0';
  kMockCiphertext[0xb] = '\0';
  kMockCiphertext[0xc] = '\0';
  kMockCiphertext[0xd] = '\0';
  kMockCiphertext[0xe] = '\0';
  kMockCiphertext[0xf] = '\0';
  kMockCiphertext[0x10] = '\0';
  kMockCiphertext[0x11] = '\0';
  kMockCiphertext[0x12] = '\0';
  kMockCiphertext[0x13] = '\0';
  kMockCiphertext[0x14] = '\0';
  kMockCiphertext[0x15] = '\0';
  kMockCiphertext[0x16] = '\0';
  kMockCiphertext[0x17] = '\0';
  kMockCiphertext[0] = '\0';
  kMockCiphertext[1] = '\0';
  kMockCiphertext[2] = '\0';
  kMockCiphertext[3] = '\0';
  kMockCiphertext[4] = '\0';
  kMockCiphertext[5] = '\0';
  kMockCiphertext[6] = '\0';
  kMockCiphertext[7] = '\0';
  kMockCiphertext[0x58] = '\0';
  kMockCiphertext[0x59] = '\0';
  kMockCiphertext[0x5a] = '\0';
  kMockCiphertext[0x5b] = '\0';
  kMockCiphertextLen = 0xff;
  unique0x100005f3 = this;
  X25519_keypair((uint8_t *)&sender_ctx.ctx_.is_sender,public_key_r + 0x18);
  internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
  StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup> *
                 )local_390);
  peVar3 = internal::
           StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::get
                     ((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                       *)local_390);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  local_3d4 = EVP_HPKE_CTX_setup_sender
                        (peVar3,(uint8_t *)&enc_len,(size_t *)&gtest_ar_.message_,0x20,kem,kdf,aead,
                         (uint8_t *)&sender_ctx.ctx_.is_sender,0x20,(uint8_t *)0x0,0);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_3d0,&local_3d4,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_418,(internal *)local_3d0,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0)"
               ,"false","true",(char *)kdf);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x234,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3f8,local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  if (bVar1) {
    peVar3 = internal::
             StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::get
                       ((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                         *)local_390);
    pcVar4 = (char *)0x50;
    iVar2 = EVP_HPKE_CTX_open(peVar3,(uint8_t *)&cleartext_len,(size_t *)&gtest_ar__1.message_,0x80,
                              (uint8_t *)&kMockCiphertextLen,0x50,(uint8_t *)0x0,0);
    local_4c1 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
    if (!bVar1) {
      testing::Message::Message(&local_4d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4f8,(internal *)local_4c0,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_open(sender_ctx.get(), cleartext, &cleartext_len, sizeof(cleartext), kMockCiphertext, kMockCiphertextLen, nullptr, 0)"
                 ,"true","false",pcVar4);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x23b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
      testing::internal::AssertHelper::~AssertHelper(&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      testing::Message::~Message(&local_4d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  }
  internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
  ~StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                   *)local_390);
  return;
}

Assistant:

TEST(HPKETest, SenderInvalidOpen) {
  const uint8_t kMockCiphertext[100] = {0xff};
  const size_t kMockCiphertextLen = 80;

  // Generate the recipient's keypair.
  uint8_t secret_key_r[X25519_PRIVATE_KEY_LEN];
  uint8_t public_key_r[X25519_PUBLIC_VALUE_LEN];
  X25519_keypair(public_key_r, secret_key_r);

  // Set up the sender.
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN];
  size_t enc_len;
  ASSERT_TRUE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0));

  // Call Open() on the sender.
  uint8_t cleartext[128];
  size_t cleartext_len;
  ASSERT_FALSE(EVP_HPKE_CTX_open(sender_ctx.get(), cleartext, &cleartext_len,
                                 sizeof(cleartext), kMockCiphertext,
                                 kMockCiphertextLen, nullptr, 0));
}